

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTex2DCase::iterate(UploadTex2DCase *this)

{
  RenderContext *context;
  anon_unknown_1 *this_00;
  bool bVar1;
  int iVar2;
  GLenum err;
  undefined4 extraout_var;
  ConstPixelBufferAccess *result;
  char *description;
  ConstPixelBufferAccess local_128;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  TextureLevel stencilOnlyLevel;
  TextureLevel readLevel;
  TextureLevel uploadLevel;
  ConstPixelBufferAccess local_40;
  Functions *gl;
  
  result = &local_128;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&depthStencilTex,context);
  readLevel.m_format = glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel(&uploadLevel,&readLevel.m_format,0x81,0x71,1);
  stencilOnlyLevel.m_format.order = RGBA;
  stencilOnlyLevel.m_format.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(&readLevel,&stencilOnlyLevel.m_format,0x81,0x71,1);
  local_128.m_format.order = S;
  local_128.m_format.type = UNSIGNED_INT8;
  tcu::TextureLevel::TextureLevel(&stencilOnlyLevel,&local_128.m_format,0x81,0x71,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&uploadLevel);
  renderTestPatternReference((PixelBufferAccess *)&local_128);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&stencilOnlyLevel);
  renderTestPatternReference((PixelBufferAccess *)&local_128);
  (*gl->bindTexture)(0xde1,depthStencilTex.super_ObjectWrapper.m_object);
  (*gl->texStorage2D)(0xde1,1,this->m_format,0x81,0x71);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_128,&uploadLevel);
  glu::texSubImage2D(context,0xde1,0,0,0,&local_128);
  err = (*gl->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x220);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8236,0x81,0x71);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(gl);
  blitStencilToColor2D(context,depthStencilTex.super_ObjectWrapper.m_object,0x81,0x71);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_128,&readLevel);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&local_128);
  this_00 = (anon_unknown_1 *)
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_128,&stencilOnlyLevel);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_40,&readLevel);
  bVar1 = compareStencilToRed(this_00,(TestLog *)&local_128,&local_40,result);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel(&stencilOnlyLevel);
  tcu::TextureLevel::~TextureLevel(&readLevel);
  tcu::TextureLevel::~TextureLevel(&uploadLevel);
  glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 129;
		const int					height				= 113;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height);
		TextureLevel				readLevel			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				stencilOnlyLevel	(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		renderTestPatternReference(uploadLevel);
		renderTestPatternReference(stencilOnlyLevel);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);
		glu::texSubImage2D(renderCtx, GL_TEXTURE_2D, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, readLevel);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), stencilOnlyLevel, readLevel);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}